

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strparse.c
# Opt level: O3

int Curl_str_quotedword(char **linep,Curl_str *out,size_t max)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  
  pcVar3 = *linep;
  out->str = (char *)0x0;
  out->len = 0;
  iVar1 = 3;
  if (*pcVar3 == '\"') {
    pcVar3 = pcVar3 + 2;
    uVar2 = 0;
    while( true ) {
      if (pcVar3[-1] == '\0') {
        return 4;
      }
      if (pcVar3[-1] == '\"') break;
      uVar2 = uVar2 + 1;
      pcVar3 = pcVar3 + 1;
      if (max < uVar2) {
        return 1;
      }
    }
    out->str = *linep + 1;
    out->len = uVar2;
    *linep = pcVar3;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int Curl_str_quotedword(const char **linep, struct Curl_str *out,
                        const size_t max)
{
  const char *s = *linep;
  size_t len = 0;
  DEBUGASSERT(linep && *linep && out && max);

  Curl_str_init(out);
  if(*s != '\"')
    return STRE_BEGQUOTE;
  s++;
  while(*s && (*s != '\"')) {
    s++;
    if(++len > max)
      return STRE_BIG;
  }
  if(*s != '\"')
    return STRE_ENDQUOTE;
  out->str = (*linep) + 1;
  out->len = len;
  *linep = s + 1;
  return STRE_OK;
}